

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void array_suite::test_integer_nested_many_siblings(void)

{
  undefined4 local_3fc;
  size_type local_3f8;
  undefined4 local_3ec;
  value local_3e8;
  undefined1 local_3e3;
  undefined1 local_3e2 [2];
  view_type local_3e0;
  view_type local_3c8;
  undefined4 local_3b4;
  size_type local_3b0;
  undefined4 local_3a4;
  value local_3a0;
  undefined1 local_39b;
  undefined1 local_39a [2];
  view_type local_398;
  view_type local_380;
  undefined4 local_36c;
  size_type local_368;
  undefined4 local_35c;
  value local_358;
  undefined1 local_353;
  undefined1 local_352 [2];
  view_type local_350;
  view_type local_338;
  undefined4 local_324;
  size_type local_320 [2];
  undefined4 local_310;
  int local_30c [2];
  undefined4 local_304;
  value local_300;
  undefined1 local_2fb;
  undefined1 local_2fa [2];
  view_type local_2f8;
  view_type local_2e0;
  undefined4 local_2cc;
  size_type local_2c8;
  undefined4 local_2bc;
  value local_2b8;
  undefined1 local_2b3;
  undefined1 local_2b2 [2];
  view_type local_2b0;
  view_type local_298;
  undefined4 local_284;
  size_type local_280;
  undefined4 local_274;
  value local_270;
  undefined1 local_26b;
  undefined1 local_26a [2];
  view_type local_268;
  view_type local_250;
  undefined4 local_23c;
  size_type local_238 [2];
  undefined4 local_228;
  int local_224 [2];
  undefined4 local_21c;
  value local_218;
  undefined1 local_213;
  undefined1 local_212 [2];
  view_type local_210;
  view_type local_1f8;
  undefined4 local_1e4;
  size_type local_1e0;
  undefined4 local_1d4;
  value local_1d0;
  undefined1 local_1cb;
  undefined1 local_1ca [2];
  view_type local_1c8;
  view_type local_1b0;
  undefined4 local_19c;
  size_type local_198 [3];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [10];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x5d325b2c5d315b5b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,399,"void array_suite::test_integer_nested_many_siblings()",local_178,&local_17c);
  local_198[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_19c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,400,"void array_suite::test_integer_nested_many_siblings()",local_198,&local_19c);
  local_1b0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x191,"void array_suite::test_integer_nested_many_siblings()",&local_1b0,"[");
  local_1c8 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[9]>
            ("reader.tail()","\"[1],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x192,"void array_suite::test_integer_nested_many_siblings()",&local_1c8,"[1],[2]]");
  local_1ca[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_1cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x194,"void array_suite::test_integer_nested_many_siblings()",local_1ca,&local_1cb);
  local_1d0 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_1d4 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x195,"void array_suite::test_integer_nested_many_siblings()",&local_1d0,&local_1d4);
  local_1e0 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_1e4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x196,"void array_suite::test_integer_nested_many_siblings()",&local_1e0,&local_1e4);
  local_1f8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x197,"void array_suite::test_integer_nested_many_siblings()",&local_1f8,"[");
  local_210 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.tail()","\"1],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x198,"void array_suite::test_integer_nested_many_siblings()",&local_210,"1],[2]]");
  local_212[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_213 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19a,"void array_suite::test_integer_nested_many_siblings()",local_212,&local_213);
  local_218 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_21c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19b,"void array_suite::test_integer_nested_many_siblings()",&local_218,&local_21c);
  local_224[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_160);
  local_228 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19c,"void array_suite::test_integer_nested_many_siblings()",local_224,&local_228);
  local_238[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_23c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19d,"void array_suite::test_integer_nested_many_siblings()",local_238,&local_23c);
  local_250 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19e,"void array_suite::test_integer_nested_many_siblings()",&local_250,"1");
  local_268 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[7]>
            ("reader.tail()","\"],[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x19f,"void array_suite::test_integer_nested_many_siblings()",&local_268,"],[2]]");
  local_26a[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_26b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a1,"void array_suite::test_integer_nested_many_siblings()",local_26a,&local_26b);
  local_270 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_274 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a2,"void array_suite::test_integer_nested_many_siblings()",&local_270,&local_274);
  local_280 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_284 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a3,"void array_suite::test_integer_nested_many_siblings()",&local_280,&local_284);
  local_298 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a4,"void array_suite::test_integer_nested_many_siblings()",&local_298,"]");
  local_2b0 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("reader.tail()","\",[2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a5,"void array_suite::test_integer_nested_many_siblings()",&local_2b0,",[2]]");
  local_2b2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_2b3 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a7,"void array_suite::test_integer_nested_many_siblings()",local_2b2,&local_2b3);
  local_2b8 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_2bc = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a8,"void array_suite::test_integer_nested_many_siblings()",&local_2b8,&local_2bc);
  local_2c8 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_2cc = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1a9,"void array_suite::test_integer_nested_many_siblings()",&local_2c8,&local_2cc);
  local_2e0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1aa,"void array_suite::test_integer_nested_many_siblings()",&local_2e0,"[");
  local_2f8 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.tail()","\"2]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ab,"void array_suite::test_integer_nested_many_siblings()",&local_2f8,"2]]");
  local_2fa[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_2fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ad,"void array_suite::test_integer_nested_many_siblings()",local_2fa,&local_2fb);
  local_300 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_304 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ae,"void array_suite::test_integer_nested_many_siblings()",&local_300,&local_304);
  local_30c[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_160);
  local_310 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1af,"void array_suite::test_integer_nested_many_siblings()",local_30c,&local_310);
  local_320[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_324 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b0,"void array_suite::test_integer_nested_many_siblings()",local_320,&local_324);
  local_338 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b1,"void array_suite::test_integer_nested_many_siblings()",&local_338,"2");
  local_350 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[3]>
            ("reader.tail()","\"]]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b2,"void array_suite::test_integer_nested_many_siblings()",&local_350,"]]");
  local_352[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_353 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b4,"void array_suite::test_integer_nested_many_siblings()",local_352,&local_353);
  local_358 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_35c = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b5,"void array_suite::test_integer_nested_many_siblings()",&local_358,&local_35c);
  local_368 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_36c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b6,"void array_suite::test_integer_nested_many_siblings()",&local_368,&local_36c);
  local_380 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b7,"void array_suite::test_integer_nested_many_siblings()",&local_380,"]");
  local_398 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.tail()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1b8,"void array_suite::test_integer_nested_many_siblings()",&local_398,"]");
  local_39a[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_39b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1ba,"void array_suite::test_integer_nested_many_siblings()",local_39a,&local_39b);
  local_3a0 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_3a4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bb,"void array_suite::test_integer_nested_many_siblings()",&local_3a0,&local_3a4);
  local_3b0 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_3b4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bc,"void array_suite::test_integer_nested_many_siblings()",&local_3b0,&local_3b4);
  local_3c8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1bd,"void array_suite::test_integer_nested_many_siblings()",&local_3c8,"]");
  local_3e0 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_160);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ("reader.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1be,"void array_suite::test_integer_nested_many_siblings()",&local_3e0,"");
  local_3e2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_3e3 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c0,"void array_suite::test_integer_nested_many_siblings()",local_3e2,&local_3e3);
  local_3e8 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_3ec = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c1,"void array_suite::test_integer_nested_many_siblings()",&local_3e8,&local_3ec);
  local_3f8 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_160);
  local_3fc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x1c2,"void array_suite::test_integer_nested_many_siblings()",&local_3f8,&local_3fc);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void test_integer_nested_many_siblings()
{
    const char input[] = "[[1],[2]]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "[1],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "1],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "],[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",[2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "2]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "2");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
}